

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void Assimp::BlenderImporter::CheckActualType(ElemBase *dt,char *check)

{
  int iVar1;
  ostream *poVar2;
  string local_1b0;
  long local_190 [3];
  uint auStack_178 [88];
  
  if (dt != (ElemBase *)0x0) {
    iVar1 = strcmp(dt->dna_type,check);
    if (iVar1 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::operator<<((ostream *)local_190,"Expected object at ");
      *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
           *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<void_const*>(local_190);
      std::operator<<((ostream *)local_190," to be of type `");
      std::operator<<((ostream *)local_190,check);
      std::operator<<((ostream *)local_190,"`, but it claims to be a `");
      poVar2 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         local_190,&dt->dna_type);
      std::operator<<(poVar2,"`instead");
      std::__cxx11::stringbuf::str();
      LogFunctions<Assimp::BlenderImporter>::ThrowException(&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    }
    return;
  }
  __assert_fail("dt",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderLoader.cpp"
                ,0x30a,
                "static void Assimp::BlenderImporter::CheckActualType(const ElemBase *, const char *)"
               );
}

Assistant:

void BlenderImporter::CheckActualType(const ElemBase* dt, const char* check)
{
    ai_assert(dt);
    if (strcmp(dt->dna_type,check)) {
        ThrowException((format(),
            "Expected object at ",std::hex,dt," to be of type `",check,
            "`, but it claims to be a `",dt->dna_type,"`instead"
        ));
    }
}